

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::get_active_uniform_block_name
               (NegativeTestContext *ctx)

{
  ostringstream *this;
  RenderContext *renderCtx;
  GLuint program_00;
  long lVar1;
  GLint numActiveBlocks;
  GLsizei length;
  GLchar uniformBlockName [128];
  ProgramSources sources;
  ShaderProgram program;
  GLuint local_36c;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined1 local_280 [16];
  undefined1 local_270 [104];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram local_100;
  
  renderCtx = ctx->m_renderCtx;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_328,
             "${GLSL_VERSION_DECL}\nuniform mediump vec4 vUnif_vec4;\nin mediump vec4 attr;layout(shared) uniform Block { mediump vec4 blockVar; };\nvoid main (void)\n{\n\tgl_Position = vUnif_vec4 + blockVar + attr;\n}\n"
             ,"");
  getVtxFragVersionSources(&local_308,&local_328,ctx);
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_348,
             "${GLSL_VERSION_DECL}\nuniform mediump ivec4 fUnif_ivec4;\nuniform mediump uvec4 fUnif_uvec4;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(vec4(fUnif_ivec4) + vec4(fUnif_uvec4));\n}\n"
             ,"");
  getVtxFragVersionSources(&local_368,&local_348,ctx);
  local_1d0[0x10] = 0;
  local_1d0._17_8_ = 0;
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0[8] = 0;
  local_1d0._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_280,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_280,&local_308);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_270 + 8),&local_368);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar1 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_368._M_dataplus._M_p._4_4_,local_368._M_dataplus._M_p._0_4_) !=
      &local_368.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_368._M_dataplus._M_p._4_4_,local_368._M_dataplus._M_p._0_4_),
                    local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  program_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  local_368._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_36c = 0xffffffff;
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_308.field_2._M_allocated_capacity = 0;
  local_308.field_2._8_8_ = 0;
  local_308._M_dataplus._M_p = (pointer)0x0;
  local_308._M_string_length = 0;
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,local_100.m_program.m_program,0x8a36,(GLint *)&local_36c);
  local_280._0_8_ = (ctx->super_CallLogWrapper).m_log;
  this = (ostringstream *)(local_280 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"// GL_ACTIVE_UNIFORM_BLOCKS = ",0x1e);
  std::ostream::operator<<(this,local_36c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," (expected 1).",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_208);
  NegativeTestContext::expectError(ctx,0);
  local_280._0_8_ = (pointer)local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,
             "GL_INVALID_OPERATION is generated if program is the name of a shader object.","");
  NegativeTestContext::beginSection(ctx,(string *)local_280);
  if ((pointer)local_280._0_8_ != (pointer)local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270._0_8_ + 1));
  }
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (&ctx->super_CallLogWrapper,program_00,local_36c,0x8a3f,(GLsizei *)&local_368,
             (GLchar *)&local_308);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  local_280._0_8_ = (pointer)local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,
             "GL_INVALID_VALUE is generated if program is not the name of either a program or shader object."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_280);
  if ((pointer)local_280._0_8_ != (pointer)local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270._0_8_ + 1));
  }
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (&ctx->super_CallLogWrapper,0xffffffff,local_36c,0x8a3f,(GLsizei *)&local_368,
             (GLchar *)&local_308);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_280._0_8_ = (pointer)local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,
             "GL_INVALID_VALUE is generated if uniformBlockIndex is greater than or equal to the value of GL_ACTIVE_UNIFORM_BLOCKS or is not the index of an active uniform block in program."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_280);
  if ((pointer)local_280._0_8_ != (pointer)local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270._0_8_ + 1));
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_100.m_program.m_program);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (&ctx->super_CallLogWrapper,local_100.m_program.m_program,local_36c,0x80,
             (GLsizei *)&local_368,(GLchar *)&local_308);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return;
}

Assistant:

void get_active_uniform_block_name (NegativeTestContext& ctx)
{
	glu::ShaderProgram	program			(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLuint				shader			= ctx.glCreateShader(GL_VERTEX_SHADER);
	GLsizei				length			= -1;
	GLint				numActiveBlocks	= -1;
	GLchar				uniformBlockName[128];

	deMemset(&uniformBlockName[0], 0, sizeof(uniformBlockName));

	ctx.glGetProgramiv(program.getProgram(), GL_ACTIVE_UNIFORM_BLOCKS, &numActiveBlocks);
	ctx.getLog() << TestLog::Message << "// GL_ACTIVE_UNIFORM_BLOCKS = " << numActiveBlocks << " (expected 1)." << TestLog::EndMessage;
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is the name of a shader object.");
	ctx.glGetActiveUniformBlockName(shader, numActiveBlocks, GL_UNIFORM_BLOCK_BINDING, &length, &uniformBlockName[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not the name of either a program or shader object.");
	ctx.glGetActiveUniformBlockName(-1, numActiveBlocks, GL_UNIFORM_BLOCK_BINDING, &length, &uniformBlockName[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if uniformBlockIndex is greater than or equal to the value of GL_ACTIVE_UNIFORM_BLOCKS or is not the index of an active uniform block in program.");
	ctx.glUseProgram(program.getProgram());
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetActiveUniformBlockName(program.getProgram(), numActiveBlocks, (int)sizeof(uniformBlockName), &length, &uniformBlockName[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glUseProgram(0);
}